

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# way.cc
# Opt level: O3

void re2c::fprint_way(FILE *f,way_t *w)

{
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *pvVar1;
  pointer ppVar2;
  pointer ppVar3;
  FILE *__stream;
  long lVar4;
  long lVar5;
  
  fputc(0x27,(FILE *)f);
  lVar4 = (long)(w->
                super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(w->
                super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    lVar5 = 0;
    do {
      if (lVar5 != 0) {
        fputc(0x20,(FILE *)f);
      }
      __stream = _stderr;
      pvVar1 = (w->
               super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar5];
      if (pvVar1 == (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)0x0) {
        fprint_way((re2c *)_stderr);
      }
      else {
        ppVar2 = (pvVar1->
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = *(pointer *)
                  ((long)&(pvVar1->
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data + 8);
        if (((long)ppVar3 - (long)ppVar2 == 8) && (ppVar2->first == ppVar2->second)) {
          fprintf(_stderr,"\\x%X");
        }
        else {
          fputc(0x5b,_stderr);
          if (ppVar3 != ppVar2) {
            fprint_way();
          }
          fputc(0x5d,__stream);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  fputc(0x27,(FILE *)f);
  return;
}

Assistant:

void fprint_way (FILE * f, const way_t & w)
{
	fprintf (f, "'");
	const size_t len = w.size ();
	for (size_t i = 0 ; i < len; ++i)
	{
		if (i > 0)
		{
			fprintf (f, " ");
		}
		if (w[i] == NULL)
		{
			fprintf (stderr, "(nil)");
		}
		else
		{
			fprint_way_arc (stderr, *w[i]);
		}
	}
	fprintf (f, "'");
}